

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobalImport(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  Result RVar1;
  undefined8 in_RAX;
  undefined3 in_register_00000009;
  Enum EVar2;
  GlobalType local_28;
  
  local_28._4_4_ = SUB84((ulong)in_RAX >> 0x20,0);
  EVar2 = Ok;
  if ((CONCAT31(in_register_00000009,mutable_) != 0) &&
     ((this->options_).features.mutable_globals_enabled_ == false)) {
    RVar1 = PrintError(this,loc,"mutable globals cannot be imported");
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  local_28.mutable_ = mutable_;
  local_28.type.enum_ = type.enum_;
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::emplace_back<wabt::SharedValidator::GlobalType>(&this->globals_,&local_28);
  this->num_imported_globals_ = this->num_imported_globals_ + 1;
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnGlobalImport(const Location& loc,
                                       Type type,
                                       bool mutable_) {
  Result result = Result::Ok;
  if (mutable_ && !options_.features.mutable_globals_enabled()) {
    result |= PrintError(loc, "mutable globals cannot be imported");
  }
  globals_.push_back(GlobalType{type, mutable_});
  ++num_imported_globals_;
  return result;
}